

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_ss.c
# Opt level: O2

int sourceGetbuf(gdIOCtx *ctx,void *buf,int size)

{
  int iVar1;
  
  iVar1 = (**(code **)ctx[1].getC)(*(undefined8 *)(ctx[1].getC + 8));
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int sourceGetbuf(gdIOCtx *ctx, void *buf, int size)
{
	ssIOCtx *lctx;
	int res;

	lctx = (ssIOCtx *)ctx;

	res = ((lctx->src->source)(lctx->src->context, buf, size));

	/*
	 * Translate the return values from the Source object:
	 * 0 is EOF, -1 is error
	 */

	if (res == 0) {
		return 0;
	} else if (res < 0) {
		return 0;
	} else {
		return res;
	}
}